

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void mov_DdRd(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  ulong uVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  uint uVar11;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  }
  else {
    (pMyDisasm->Instruction).Category = 0xa0000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"mov",4);
    (pMyDisasm->Reserved_).OperandSize =
         (uint)((pMyDisasm->Reserved_).Architecture == 0x40) * 0x20 + 0x20;
    uVar3 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar3 == 0) || ((pMyDisasm->Reserved_).EIP_ + 2 <= uVar3)) {
      uVar11 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) & 7;
      (pMyDisasm->Reserved_).RM_ = uVar11;
      (*ModRM_3[uVar11])(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 0x80;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar4 = EFLAGS_TABLE[0x43].SF_;
      UVar5 = EFLAGS_TABLE[0x43].ZF_;
      UVar6 = EFLAGS_TABLE[0x43].AF_;
      UVar7 = EFLAGS_TABLE[0x43].PF_;
      UVar8 = EFLAGS_TABLE[0x43].CF_;
      UVar9 = EFLAGS_TABLE[0x43].TF_;
      UVar10 = EFLAGS_TABLE[0x43].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x43].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar4;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar5;
      (pMyDisasm->Instruction).Flags.AF_ = UVar6;
      (pMyDisasm->Instruction).Flags.PF_ = UVar7;
      (pMyDisasm->Instruction).Flags.CF_ = UVar8;
      (pMyDisasm->Instruction).Flags.TF_ = UVar9;
      (pMyDisasm->Instruction).Flags.IF_ = UVar10;
      UVar4 = EFLAGS_TABLE[0x43].NT_;
      UVar5 = EFLAGS_TABLE[0x43].RF_;
      UVar6 = EFLAGS_TABLE[0x43].alignment;
      (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x43].DF_;
      (pMyDisasm->Instruction).Flags.NT_ = UVar4;
      (pMyDisasm->Instruction).Flags.RF_ = UVar5;
      (pMyDisasm->Instruction).Flags.alignment = UVar6;
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
    }
    else {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ mov_DdRd(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  pMyDisasm->Instruction.Category = SYSTEM_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mov");
  #endif
  GV.OperandSize = (GV.Architecture == 64) ? 64 : 32;
  if (!Security(2, pMyDisasm)) return;
  GV.RM_  = (*((UInt8*) (GV.EIP_+1))) & 0x7;
  ModRM_3[GV.RM_](&pMyDisasm->Operand2, pMyDisasm);
  GV.Register_ = DR_REG;
  decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);

  FillFlags(pMyDisasm,67);
  GV.EIP_ += 2;
}